

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O0

void writeSol(char *fout,cupdlp_int nCols,cupdlp_int nRows,cupdlp_float *col_value,
             cupdlp_float *col_dual,cupdlp_float *row_value,cupdlp_float *row_dual)

{
  FILE *__stream;
  long in_RCX;
  uint in_EDX;
  uint in_ESI;
  char *in_RDI;
  long in_R8;
  long in_R9;
  int i_3;
  int i_2;
  int i_1;
  int i;
  FILE *fptr;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  printf("--------------------------------\n");
  printf("--- saving sol to %s\n",in_RDI);
  printf("--------------------------------\n");
  __stream = fopen(in_RDI,"w");
  fprintf(__stream,"{");
  fprintf(__stream,"\n");
  fprintf(__stream,"\"nCols\": %d",(ulong)in_ESI);
  fprintf(__stream,",\n");
  fprintf(__stream,"\"nRows\": %d",(ulong)in_EDX);
  fprintf(__stream,",\n");
  fprintf(__stream,"\"col_value\": [");
  if ((in_RCX != 0) && (in_ESI != 0)) {
    for (local_34 = 0; local_34 < (int)(in_ESI - 1); local_34 = local_34 + 1) {
      fprintf(__stream,"%.14f,",*(undefined8 *)(in_RCX + (long)local_34 * 8));
    }
    fprintf(__stream,"%.14f",*(undefined8 *)(in_RCX + (long)(int)(in_ESI - 1) * 8));
  }
  fprintf(__stream,"]");
  fprintf(__stream,",\n");
  fprintf(__stream,"\"col_dual\": [");
  if ((in_R8 != 0) && (in_ESI != 0)) {
    for (local_38 = 0; local_38 < (int)(in_ESI - 1); local_38 = local_38 + 1) {
      fprintf(__stream,"%.14f,",*(undefined8 *)(in_R8 + (long)local_38 * 8));
    }
    fprintf(__stream,"%.14f",*(undefined8 *)(in_R8 + (long)(int)(in_ESI - 1) * 8));
  }
  fprintf(__stream,"]");
  fprintf(__stream,",\n");
  fprintf(__stream,"\"row_value\": [");
  if ((in_R9 != 0) && (in_EDX != 0)) {
    for (local_3c = 0; local_3c < (int)(in_EDX - 1); local_3c = local_3c + 1) {
      fprintf(__stream,"%.14f,",*(undefined8 *)(in_R9 + (long)local_3c * 8));
    }
    fprintf(__stream,"%.14f",*(undefined8 *)(in_R9 + (long)(int)(in_EDX - 1) * 8));
  }
  fprintf(__stream,"]");
  fprintf(__stream,",\n");
  fprintf(__stream,"\"row_dual\": [");
  if ((_i_3 != 0) && (in_EDX != 0)) {
    for (local_40 = 0; local_40 < (int)(in_EDX - 1); local_40 = local_40 + 1) {
      fprintf(__stream,"%.14f,",*(undefined8 *)(_i_3 + (long)local_40 * 8));
    }
    fprintf(__stream,"%.14f",*(undefined8 *)(_i_3 + (long)(int)(in_EDX - 1) * 8));
  }
  fprintf(__stream,"]");
  fprintf(__stream,"\n");
  fprintf(__stream,"}");
  fclose(__stream);
  return;
}

Assistant:

void writeSol(const char *fout, cupdlp_int nCols, cupdlp_int nRows,
              cupdlp_float *col_value, cupdlp_float *col_dual,
              cupdlp_float *row_value, cupdlp_float *row_dual) {
  FILE *fptr;

  cupdlp_printf("--------------------------------\n");
  cupdlp_printf("--- saving sol to %s\n", fout);
  cupdlp_printf("--------------------------------\n");
  // Open a file in writing mode
  fptr = fopen(fout, "w");
  fprintf(fptr, "{");

  // nCols
  fprintf(fptr, "\n");

  fprintf(fptr, "\"nCols\": %d", nCols);

  // nRows
  fprintf(fptr, ",\n");

  fprintf(fptr, "\"nRows\": %d", nRows);

  // col value
  fprintf(fptr, ",\n");

  fprintf(fptr, "\"col_value\": [");
  if (col_value && nCols) {
    for (int i = 0; i < nCols - 1; ++i) {
      fprintf(fptr, "%.14f,", col_value[i]);
    }
    fprintf(fptr, "%.14f", col_value[nCols - 1]);
  }
  fprintf(fptr, "]");

  // col dual
  fprintf(fptr, ",\n");
  fprintf(fptr, "\"col_dual\": [");
  if (col_dual && nCols) {
    for (int i = 0; i < nCols - 1; ++i) {
      fprintf(fptr, "%.14f,", col_dual[i]);
    }
    fprintf(fptr, "%.14f", col_dual[nCols - 1]);
  }
  fprintf(fptr, "]");

  // row value
  fprintf(fptr, ",\n");
  fprintf(fptr, "\"row_value\": [");
  if (row_value && nRows) {
    for (int i = 0; i < nRows - 1; ++i) {
      fprintf(fptr, "%.14f,", row_value[i]);
    }
    fprintf(fptr, "%.14f", row_value[nRows - 1]);
  }
  fprintf(fptr, "]");

  // row dual
  fprintf(fptr, ",\n");
  fprintf(fptr, "\"row_dual\": [");
  if (row_dual && nRows) {
    for (int i = 0; i < nRows - 1; ++i) {
      fprintf(fptr, "%.14f,", row_dual[i]);
    }
    fprintf(fptr, "%.14f", row_dual[nRows - 1]);
  }
  fprintf(fptr, "]");

  // end writing
  fprintf(fptr, "\n");
  fprintf(fptr, "}");

  // Close the file
  fclose(fptr);
}